

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSplitLimit
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  double dVar1;
  pointer pVVar2;
  HeapEntity *pHVar3;
  HeapEntity *pHVar4;
  long lVar5;
  ulong uVar6;
  Interpreter *this_00;
  int iVar7;
  _Rb_tree_header *p_Var8;
  HeapThunk *pHVar9;
  allocator_type *in_RCX;
  HeapEntity *args_2;
  size_type sVar10;
  uint uVar11;
  _Link_type __x;
  _Link_type __x_00;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_01;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar12;
  HeapThunk *th;
  undefined1 local_b8 [44];
  uint local_8c;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_88;
  Interpreter *local_80;
  HeapEntity *local_78;
  value_type local_70;
  undefined4 local_68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_60;
  Identifier **local_58;
  HeapEntity *local_50;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  __x_00 = (_Link_type)local_b8;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"splitLimit","");
  local_70 = (HeapThunk *)0x1300000013;
  local_68 = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_70;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_48,__l,in_RCX);
  params = &local_48;
  args_2 = (HeapEntity *)args;
  validateBuiltinArgs(this,loc,(string *)local_b8,args,params);
  if (local_48.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (pVVar2->v).h;
  pHVar4 = pVVar2[1].v.h;
  dVar1 = pVVar2[2].v.d;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (_Base_ptr)0x0;
  local_b8._16_8_ = 0;
  VVar12 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                           *)local_b8);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar12._0_8_;
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  local_50 = (this->scratch).v.h;
  local_78 = local_50 + 1;
  local_88 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             (pHVar3 + 1);
  lVar5._0_1_ = pHVar3[1].mark;
  lVar5._1_1_ = pHVar3[1].type;
  lVar5._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
  if (lVar5 == 0) {
    sVar10 = 0;
  }
  else {
    this_01 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
              (pHVar4 + 1);
    local_58 = &this->idArrayElement;
    sVar10 = 0;
    local_8c = 0;
    uVar11 = 0;
    local_80 = this;
    local_60 = this_01;
    do {
      if (((long)dVar1 != 0xffffffffffffffff) &&
         (args_2 = local_50,
         (ulong)(long)dVar1 <=
         (ulong)(*(long *)&local_50[1].mark - (long)local_50[1]._vptr_HeapEntity >> 3))) break;
      args_2 = *(HeapEntity **)&pHVar4[1].mark;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_b8,local_88,sVar10,(size_type)args_2);
      iVar7 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                        (this_01,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                  *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ * 4 + 4);
      }
      this_00 = local_80;
      if (iVar7 == 0) {
        local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
        pHVar9 = (anonymous_namespace)::Interpreter::
                 makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                           ((Interpreter *)local_80,local_58,(void **)local_b8,(int *)args_2,
                            (void **)params);
        local_70 = pHVar9;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)local_78,&local_70);
        args_2 = (HeapEntity *)(ulong)(uVar11 - local_8c);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_b8,local_88,(ulong)local_8c,(size_type)args_2);
        __x = (_Link_type)local_b8;
        VVar12 = makeString(this_00,(UString *)local_b8);
        (pHVar9->content).t = STRING;
        (pHVar9->content).v = VVar12._0_8_;
        (pHVar9->super_HeapEntity).field_0xa = 1;
        pHVar9->self = (HeapObject *)0x0;
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)(pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x)
        ;
        p_Var8 = &(pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header;
        (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header
        ;
        (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var8->_M_header;
        (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ * 4 + 4);
        }
        uVar11 = uVar11 + *(int *)&pHVar4[1].mark;
        this_01 = local_60;
        local_8c = uVar11;
      }
      else {
        uVar11 = uVar11 + 1;
      }
      sVar10 = (size_type)uVar11;
      uVar6._0_1_ = pHVar3[1].mark;
      uVar6._1_1_ = pHVar3[1].type;
      uVar6._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
    } while (sVar10 < uVar6);
    sVar10 = (size_type)local_8c;
    this = local_80;
  }
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  pHVar9 = (anonymous_namespace)::Interpreter::
           makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                     ((Interpreter *)this,&this->idArrayElement,(void **)local_b8,(int *)args_2,
                      (void **)params);
  local_70 = pHVar9;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)local_78,&local_70);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_b8,
         local_88,sVar10,0xffffffffffffffff);
  VVar12 = makeString(this,(UString *)local_b8);
  (pHVar9->content).t = STRING;
  (pHVar9->content).v = VVar12._0_8_;
  (pHVar9->super_HeapEntity).field_0xa = 1;
  pHVar9->self = (HeapObject *)0x0;
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              *)(pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x_00);
  p_Var8 = &(pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header;
  (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  (pHVar9->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ * 4 + 4);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinSplitLimit(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "splitLimit", args, {Value::STRING, Value::STRING, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *c = static_cast<const HeapString *>(args[1].v.h);
        long maxsplits = long(args[2].v.d);
        unsigned start = 0;
        unsigned test = 0;
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        while (test < str->value.size() && (maxsplits == -1 ||
                                            size_t(maxsplits) > elements.size())) {
            if (c->value == str->value.substr(test, c->value.size())) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeString(str->value.substr(start, test - start)));
                start = test + c->value.size();
                test = start;
            } else {
                ++test;
            }
        }
        auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
        elements.push_back(th);
        th->fill(makeString(str->value.substr(start)));

        return nullptr;
    }